

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtVector3.h
# Opt level: O2

cbtVector3 * __thiscall cbtVector3::operator+=(cbtVector3 *this,cbtVector3 *v)

{
  this->m_floats[0] = v->m_floats[0] + this->m_floats[0];
  this->m_floats[1] = v->m_floats[1] + this->m_floats[1];
  this->m_floats[2] = v->m_floats[2] + this->m_floats[2];
  return this;
}

Assistant:

SIMD_FORCE_INLINE cbtVector3& operator+=(const cbtVector3& v)
	{
#if defined(BT_USE_SSE_IN_API) && defined(BT_USE_SSE)
		mVec128 = _mm_add_ps(mVec128, v.mVec128);
#elif defined(BT_USE_NEON)
		mVec128 = vaddq_f32(mVec128, v.mVec128);
#else
		m_floats[0] += v.m_floats[0];
		m_floats[1] += v.m_floats[1];
		m_floats[2] += v.m_floats[2];
#endif
		return *this;
	}